

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

int __thiscall cmCPackIFWGenerator::RunBinaryCreator(cmCPackIFWGenerator *this,string *ifwTmpFile)

{
  OutputOption outputflag;
  cmCPackLog *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_810 [32];
  string local_7f0;
  undefined1 local_7d0 [8];
  ostringstream cmCPackLog_msg_2;
  string local_658;
  undefined1 local_638 [8];
  cmGeneratedFileStream ofs;
  string local_3c0 [7];
  bool res;
  undefined1 local_3a0 [8];
  ostringstream cmCPackLog_msg_1;
  int local_224;
  undefined1 local_220 [4];
  int retVal;
  string output;
  string local_1e0;
  undefined1 local_1b0 [8];
  ostringstream cmCPackLog_msg;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifwCmd;
  string *ifwTmpFile_local;
  cmCPackIFWGenerator *this_local;
  
  ifwCmd.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ifwTmpFile;
  BuildBinaryCreatorCommmand_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  poVar3 = std::operator<<((ostream *)local_1b0,"Execute: ");
  cmSystemTools::PrintSingleCommand
            (&local_1e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1e0);
  if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
    pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x11a,pcVar4);
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::__cxx11::string::string((string *)local_220);
  local_224 = 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
  poVar3 = std::operator<<((ostream *)local_3a0,"- Generate package");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
    pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x11d,pcVar4);
    std::__cxx11::string::~string(local_3c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
  outputflag = (this->super_cmCPackGenerator).GeneratorVerbose;
  ofs._608_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar2 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,(string *)local_220,(string *)local_220,&local_224,(char *)0x0,
                     outputflag,(cmDuration)ofs._608_8_,Auto);
  if ((bVar2) && (local_224 == 0)) {
    this_local._4_4_ = 1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_638,
               ifwCmd.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,false,None);
    poVar3 = std::operator<<((ostream *)local_638,"# Run command: ");
    cmSystemTools::PrintSingleCommand
              (&local_658,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
    poVar3 = std::operator<<(poVar3,(string *)&local_658);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# Output:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,(string *)local_220);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7d0);
    poVar3 = std::operator<<((ostream *)local_7d0,"Problem running IFW command: ");
    cmSystemTools::PrintSingleCommand
              (&local_7f0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
    poVar3 = std::operator<<(poVar3,(string *)&local_7f0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Please check \"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    ifwCmd.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar3 = std::operator<<(poVar3,"\" for errors");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_7f0);
    if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,299,pcVar4);
      std::__cxx11::string::~string(local_810);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7d0);
    this_local._4_4_ = 0;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_638);
  }
  std::__cxx11::string::~string((string *)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWGenerator::RunBinaryCreator(const std::string& ifwTmpFile)
{
  std::vector<std::string> ifwCmd = this->BuildBinaryCreatorCommmand();
  cmCPackIFWLogger(VERBOSE,
                   "Execute: " << cmSystemTools::PrintSingleCommand(ifwCmd)
                               << std::endl);
  std::string output;
  int retVal = 1;
  cmCPackIFWLogger(OUTPUT, "- Generate package" << std::endl);
  bool res = cmSystemTools::RunSingleCommand(ifwCmd, &output, &output, &retVal,
                                             nullptr, this->GeneratorVerbose,
                                             cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(ifwTmpFile);
    ofs << "# Run command: " << cmSystemTools::PrintSingleCommand(ifwCmd)
        << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackIFWLogger(
      ERROR,
      "Problem running IFW command: "
        << cmSystemTools::PrintSingleCommand(ifwCmd) << std::endl
        << "Please check \"" << ifwTmpFile << "\" for errors" << std::endl);
    return 0;
  }

  return 1;
}